

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_export.cpp
# Opt level: O2

SourceResultType __thiscall
duckdb::PhysicalExport::GetData
          (PhysicalExport *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  case_insensitive_map_t<vector<Value>_> *this_00;
  ClientContext *context_00;
  PhysicalExport *pPVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  pointer prVar3;
  bool bVar4;
  int iVar5;
  pointer pCVar6;
  Catalog *catalog;
  undefined4 extraout_var;
  DependencyManager *this_01;
  pointer pCVar7;
  pointer pBVar8;
  reference pvVar9;
  type pCVar10;
  ostream *poVar11;
  iterator iVar12;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *pvVar13;
  reference pvVar14;
  idx_t i;
  pointer pbVar15;
  ulong __n;
  pointer prVar16;
  Value *this_02;
  SQLString *in_R8;
  __node_base *p_Var17;
  allocator local_55b;
  allocator local_55a;
  allocator local_559;
  pointer local_558;
  PhysicalExport *local_550;
  Value local_548;
  catalog_entry_vector_t catalog_entries;
  Value local_4e8;
  GlobalSourceState *local_4a8;
  optional_ptr<duckdb::DependencyManager,_true> dependency_manager;
  key_type local_498;
  string local_478;
  string local_458;
  string file_path;
  ExportedTableData exported_table_info;
  allocator local_380 [32];
  string local_360;
  stringstream load_ss;
  ostream local_330 [376];
  stringstream ss;
  ostream local_1a8 [376];
  
  local_4a8 = input->global_state;
  if (*(char *)&local_4a8[1]._vptr_GlobalSourceState == '\0') {
    context_00 = context->client;
    local_548.value_info_.internal.
    super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)FileSystem::GetFileSystem(context_00);
    local_548.value_.bigint = (int64_t)&this->info;
    pCVar6 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                       ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *
                        )local_548.value_.bigint);
    catalog = Catalog::GetCatalog(context_00,&pCVar6->catalog);
    catalog_entries.
    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    catalog_entries.
    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    catalog_entries.
    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetNaiveExportOrder((catalog_entry_vector_t *)&ss,context->client,catalog);
    ::std::
    vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ::_M_move_assign(&catalog_entries.
                      super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                     ,&ss);
    ::std::
    _Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                     *)&ss);
    iVar5 = (*catalog->_vptr_Catalog[0x1a])(catalog);
    dependency_manager.ptr = (DependencyManager *)CONCAT44(extraout_var,iVar5);
    if (dependency_manager.ptr != (DependencyManager *)0x0) {
      this_01 = optional_ptr<duckdb::DependencyManager,_true>::operator->(&dependency_manager);
      DependencyManager::ReorderEntries(this_01,&catalog_entries,context_00);
    }
    local_550 = this;
    ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    prVar3 = catalog_entries.
             super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (prVar16 = catalog_entries.
                   super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; prVar16 != prVar3;
        prVar16 = prVar16 + 1) {
      if (prVar16->_M_data->internal == false) {
        (*prVar16->_M_data->_vptr_CatalogEntry[8])(&exported_table_info);
        pCVar7 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                 operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                             *)&exported_table_info);
        (pCVar7->catalog)._M_string_length = 0;
        *(pCVar7->catalog)._M_dataplus._M_p = '\0';
        pCVar7 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                 operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                             *)&exported_table_info);
        (*(pCVar7->super_ParseInfo)._vptr_ParseInfo[5])((string *)&load_ss,pCVar7);
        ::std::operator<<(local_1a8,(string *)&load_ss);
        ::std::__cxx11::string::~string((string *)&load_ss);
        ::std::operator<<(local_1a8,";\n");
        if (exported_table_info.table_name._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)exported_table_info.table_name._M_dataplus._M_p + 8))();
        }
      }
    }
    ::std::operator<<(local_1a8,'\n');
    pCVar6 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                       ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *
                        )local_548.value_.bigint);
    pPVar1 = local_550;
    ::std::__cxx11::string::string
              ((string *)&exported_table_info,"schema.sql",(allocator *)&local_4e8);
    _Var2._M_pi = local_548.value_info_.internal.
                  super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
    FileSystem::JoinPath
              ((string *)&load_ss,
               (FileSystem *)
               local_548.value_info_.internal.
               super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi,&pCVar6->file_path,&exported_table_info.table_name);
    WriteStringStreamToFile((FileSystem *)_Var2._M_pi,&ss,(string *)&load_ss);
    ::std::__cxx11::string::~string((string *)&load_ss);
    ::std::__cxx11::string::~string((string *)&exported_table_info);
    ::std::__cxx11::stringstream::stringstream((stringstream *)&load_ss);
    local_550 = (PhysicalExport *)&pPVar1->exported_tables;
    local_548.value_.hugeint.upper = 0;
    local_548.value_info_.internal.
    super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&file_path;
    while( true ) {
      pBVar8 = unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
               ::operator->((unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
                             *)local_550);
      if ((ulong)(((long)(pBVar8->data).
                         super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
                         .
                         super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pBVar8->data).
                        super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
                        .
                        super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0xa0) <=
          local_548.value_.uhugeint.upper) break;
      pBVar8 = unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
               ::operator->((unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
                             *)local_550);
      pvVar9 = vector<duckdb::ExportedTableInfo,_true>::get<true>
                         (&pBVar8->data,local_548.value_.uhugeint.upper);
      ExportedTableData::ExportedTableData(&exported_table_info,&pvVar9->table_data);
      pCVar10 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator*
                          ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                            *)local_548.value_.bigint);
      ::std::operator<<(local_330,"COPY ");
      bVar4 = ::std::operator!=(&exported_table_info.schema_name,"main");
      if (bVar4 && exported_table_info.schema_name._M_string_length != 0) {
        KeywordHelper::WriteOptionallyQuoted
                  ((string *)&local_4e8,&exported_table_info.schema_name,'\"',true);
        poVar11 = ::std::operator<<(local_330,(string *)&local_4e8);
        ::std::operator<<(poVar11,".");
        ::std::__cxx11::string::~string((string *)&local_4e8);
      }
      ::std::__cxx11::string::string((string *)&local_360,(string *)&exported_table_info.file_path);
      ::std::__cxx11::string::string((string *)&local_4e8,"\\",(allocator *)&local_478);
      ::std::__cxx11::string::string((string *)&local_458,"/",local_380);
      StringUtil::Replace(&file_path,&local_360,(string *)&local_4e8,&local_458);
      ::std::__cxx11::string::~string((string *)&local_458);
      ::std::__cxx11::string::~string((string *)&local_4e8);
      ::std::__cxx11::string::~string((string *)&local_360);
      ::std::__cxx11::string::string((string *)&local_458,"%s FROM %s (",(allocator *)&local_548);
      ::std::__cxx11::string::string((string *)&local_478,(string *)&exported_table_info);
      ::std::__cxx11::string::string((string *)local_380,(string *)&file_path);
      StringUtil::Format<duckdb::SQLIdentifier,duckdb::SQLString>
                ((string *)&local_4e8,(StringUtil *)&local_458,&local_478,(SQLIdentifier *)local_380
                 ,in_R8);
      ::std::operator<<(local_330,(string *)&local_4e8);
      ::std::__cxx11::string::~string((string *)&local_4e8);
      ::std::__cxx11::string::~string((string *)local_380);
      ::std::__cxx11::string::~string((string *)&local_478);
      ::std::__cxx11::string::~string((string *)&local_458);
      poVar11 = ::std::operator<<(local_330,"FORMAT \'");
      poVar11 = ::std::operator<<(poVar11,(string *)&pCVar10->format);
      ::std::operator<<(poVar11,"\'");
      bVar4 = ::std::operator==(&pCVar10->format,"csv");
      if (bVar4) {
        ::std::__cxx11::string::string((string *)&local_4e8,"header",(allocator *)&local_548);
        this_00 = &pCVar10->options;
        iVar12 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&this_00->_M_h,(key_type *)&local_4e8);
        ::std::__cxx11::string::~string((string *)&local_4e8);
        if (iVar12.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          ::std::__cxx11::string::string((string *)&local_548,"header",(allocator *)&local_498);
          pvVar13 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                    ::std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_00,(key_type *)&local_548);
          Value::INTEGER(&local_4e8,1);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                    (pvVar13,&local_4e8);
          Value::~Value(&local_4e8);
          ::std::__cxx11::string::~string((string *)&local_548);
        }
        ::std::__cxx11::string::string((string *)&local_4e8,"delimiter",&local_55b);
        iVar12 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&this_00->_M_h,(key_type *)&local_4e8);
        if (iVar12.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          ::std::__cxx11::string::string((string *)&local_548,"sep",&local_559);
          iVar12 = ::std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&this_00->_M_h,(key_type *)&local_548);
          if (iVar12.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            ::std::__cxx11::string::string((string *)&local_498,"delim",&local_55a);
            iVar12 = ::std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&this_00->_M_h,&local_498);
            ::std::__cxx11::string::~string((string *)&local_498);
            ::std::__cxx11::string::~string((string *)&local_548);
            ::std::__cxx11::string::~string((string *)&local_4e8);
            if (iVar12.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_true>
                ._M_cur != (__node_type *)0x0) goto LAB_019fbbdd;
            ::std::__cxx11::string::string((string *)&local_548,"delimiter",(allocator *)&local_498)
            ;
            pvVar13 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                      ::std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)this_00,(key_type *)&local_548);
            Value::Value(&local_4e8,",");
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
            emplace_back<duckdb::Value>(pvVar13,&local_4e8);
            Value::~Value(&local_4e8);
            this_02 = &local_548;
          }
          else {
            ::std::__cxx11::string::~string((string *)&local_548);
            this_02 = &local_4e8;
          }
          ::std::__cxx11::string::~string((string *)this_02);
        }
        else {
          ::std::__cxx11::string::~string((string *)&local_4e8);
        }
LAB_019fbbdd:
        ::std::__cxx11::string::string((string *)&local_4e8,"quote",(allocator *)&local_548);
        iVar12 = ::std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&this_00->_M_h,(key_type *)&local_4e8);
        ::std::__cxx11::string::~string((string *)&local_4e8);
        if (iVar12.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          ::std::__cxx11::string::string((string *)&local_548,"quote",(allocator *)&local_498);
          pvVar13 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                    ::std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_00,(key_type *)&local_548);
          Value::Value(&local_4e8,"\"");
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                    (pvVar13,&local_4e8);
          Value::~Value(&local_4e8);
          ::std::__cxx11::string::~string((string *)&local_548);
        }
        ::std::__cxx11::string::string
                  ((string *)&local_4e8,"force_not_null",(allocator *)&local_548);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_M_erase(&this_00->_M_h,&local_4e8);
        ::std::__cxx11::string::~string((string *)&local_4e8);
        local_558 = exported_table_info.not_null_columns.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar15 = exported_table_info.not_null_columns.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar15 != local_558;
            pbVar15 = pbVar15 + 1) {
          ::std::__cxx11::string::string((string *)&local_548,"force_not_null",&local_55b);
          pvVar13 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                    ::std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this_00,(key_type *)&local_548);
          ::std::__cxx11::string::string((string *)&local_498,(string *)pbVar15);
          Value::Value(&local_4e8,&local_498);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                    (pvVar13,&local_4e8);
          Value::~Value(&local_4e8);
          ::std::__cxx11::string::~string((string *)&local_498);
          ::std::__cxx11::string::~string((string *)&local_548);
        }
      }
      p_Var17 = &(pCVar10->options)._M_h._M_before_begin;
      while (p_Var17 = p_Var17->_M_nxt, p_Var17 != (__node_base *)0x0) {
        bVar4 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(p_Var17 + 1),"force_quote");
        if (!bVar4) {
          pvVar13 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)(p_Var17 + 5);
          if (p_Var17[5]._M_nxt == p_Var17[6]._M_nxt) {
            Value::Value(&local_4e8,1);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
            emplace_back<duckdb::Value>(pvVar13,&local_4e8);
            Value::~Value(&local_4e8);
          }
          poVar11 = ::std::operator<<(local_330,", ");
          poVar11 = ::std::operator<<(poVar11,(string *)(p_Var17 + 1));
          ::std::operator<<(poVar11," ");
          if ((long)p_Var17[6]._M_nxt - (long)p_Var17[5]._M_nxt == 0x40) {
            pvVar14 = vector<duckdb::Value,_true>::get<true>
                                ((vector<duckdb::Value,_true> *)pvVar13,0);
            Value::ToSQLString_abi_cxx11_((string *)&local_4e8,pvVar14);
            ::std::operator<<(local_330,(string *)&local_4e8);
            ::std::__cxx11::string::~string((string *)&local_4e8);
          }
          else {
            ::std::operator<<(local_330,"(");
            for (__n = 0; __n < (ulong)((long)p_Var17[6]._M_nxt - (long)p_Var17[5]._M_nxt >> 6);
                __n = __n + 1) {
              pvVar14 = vector<duckdb::Value,_true>::get<true>
                                  ((vector<duckdb::Value,_true> *)pvVar13,__n);
              Value::ToSQLString_abi_cxx11_((string *)&local_4e8,pvVar14);
              ::std::operator<<(local_330,(string *)&local_4e8);
              ::std::__cxx11::string::~string((string *)&local_4e8);
              if (__n != ((long)p_Var17[6]._M_nxt - (long)p_Var17[5]._M_nxt >> 6) - 1U) {
                ::std::operator<<(local_330,", ");
              }
            }
            ::std::operator<<(local_330,")");
          }
        }
      }
      poVar11 = ::std::operator<<(local_330,");");
      ::std::operator<<(poVar11,'\n');
      ::std::__cxx11::string::~string((string *)&file_path);
      ExportedTableData::~ExportedTableData(&exported_table_info);
      local_548.value_.hugeint.upper = local_548.value_.hugeint.upper + 1;
    }
    pCVar6 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                       ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *
                        )local_548.value_.bigint);
    ::std::__cxx11::string::string((string *)&local_4e8,"load.sql",(allocator *)&file_path);
    _Var2._M_pi = local_548.value_info_.internal.
                  super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi;
    FileSystem::JoinPath
              (&exported_table_info.table_name,
               (FileSystem *)
               local_548.value_info_.internal.
               super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi,&pCVar6->file_path,(string *)&local_4e8);
    WriteStringStreamToFile((FileSystem *)_Var2._M_pi,&load_ss,&exported_table_info.table_name);
    ::std::__cxx11::string::~string((string *)&exported_table_info);
    ::std::__cxx11::string::~string((string *)&local_4e8);
    *(undefined1 *)&local_4a8[1]._vptr_GlobalSourceState = 1;
    ::std::__cxx11::stringstream::~stringstream((stringstream *)&load_ss);
    ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    ::std::
    _Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                     *)&catalog_entries);
  }
  return FINISHED;
}

Assistant:

SourceResultType PhysicalExport::GetData(ExecutionContext &context, DataChunk &chunk,
                                         OperatorSourceInput &input) const {
	auto &state = input.global_state.Cast<ExportSourceState>();
	if (state.finished) {
		return SourceResultType::FINISHED;
	}

	auto &ccontext = context.client;
	auto &fs = FileSystem::GetFileSystem(ccontext);

	auto &catalog = Catalog::GetCatalog(ccontext, info->catalog);

	catalog_entry_vector_t catalog_entries;
	catalog_entries = GetNaiveExportOrder(context.client, catalog);
	auto dependency_manager = catalog.GetDependencyManager();
	if (dependency_manager) {
		dependency_manager->ReorderEntries(catalog_entries, ccontext);
	}

	// write the schema.sql file
	stringstream ss;
	WriteCatalogEntries(ss, catalog_entries);
	WriteStringStreamToFile(fs, ss, fs.JoinPath(info->file_path, "schema.sql"));

	// write the load.sql file
	// for every table, we write COPY INTO statement with the specified options
	stringstream load_ss;
	for (idx_t i = 0; i < exported_tables->data.size(); i++) {
		auto exported_table_info = exported_tables->data[i].table_data;
		WriteCopyStatement(fs, load_ss, *info, exported_table_info, function);
	}
	WriteStringStreamToFile(fs, load_ss, fs.JoinPath(info->file_path, "load.sql"));
	state.finished = true;

	return SourceResultType::FINISHED;
}